

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O2

vector<FatEntry,_std::allocator<FatEntry>_> * __thiscall
FatSystem::getEntries
          (vector<FatEntry,_std::allocator<FatEntry>_> *__return_storage_ptr__,FatSystem *this,
          uint cluster,int *clusters,bool *hasFree)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  unsigned_long_long address;
  iterator iVar6;
  ostream *poVar7;
  ulong uVar8;
  uint cluster_local;
  char local_1fa;
  char local_1f9;
  uint local_1f8;
  uint local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  uint local_1e0;
  uint local_1dc;
  char buffer [32];
  vector<FatEntry,_std::allocator<FatEntry>_> entries;
  string local_190;
  bool *local_170;
  string local_168;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> visited;
  FatFilename filename;
  FatEntry entry;
  
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &visited._M_t._M_impl.super__Rb_tree_header._M_header;
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  filename.data._M_dataplus._M_p = (pointer)&filename.data.field_2;
  filename.data._M_string_length = 0;
  entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  filename.data.field_2._M_local_buf[0] = '\0';
  filename.letters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filename.letters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filename.letters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (clusters != (int *)0x0) {
    *clusters = 0;
  }
  if (hasFree != (bool *)0x0) {
    *hasFree = false;
  }
  uVar8 = this->rootDirectory;
  uVar5 = (ulong)cluster;
  cluster_local = cluster;
  if (cluster == 0 && this->type == 0) {
    cluster_local = (uint)uVar8;
    uVar5 = uVar8;
  }
  uVar5 = uVar5 & 0xffffffff;
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (uVar5 < this->totalClusters) {
    local_1fa = this->type == 1 && uVar8 == uVar5;
    local_1f8 = (uint)CONCAT71((int7)((ulong)clusters >> 8),uVar8 == uVar5);
    local_1e8 = 0;
    local_1e0 = (uint)(byte)local_1fa;
    local_1f0 = 0;
    local_1f4 = 0;
    local_170 = hasFree;
    do {
      address = clusterAddress(this,(uint)uVar5,SUB41(local_1e0,0));
      iVar6 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::find((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&visited,&cluster_local);
      if ((_Rb_tree_header *)iVar6._M_node != &visited._M_t._M_impl.super__Rb_tree_header) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"! Looping directory");
        std::endl<char,std::char_traits<char>>(poVar7);
        break;
      }
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&visited,&cluster_local);
      bVar1 = 0;
      local_1ec = 0;
      local_1e4 = 0;
      for (uVar8 = 0; uVar2 = cluster_local, (uVar8 & 0xffffffff) < this->bytesPerCluster;
          uVar8 = (uVar8 & 0xffffffff) + 0x20) {
        readData(this,address,buffer,0x20);
        FatEntry::FatEntry(&entry);
        entry.attributes = buffer[0xb];
        entry.address = address;
        if (buffer[0xb] == '\x0f') {
          FatFilename::append(&filename,buffer);
        }
        else {
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          local_190.field_2._M_local_buf[0] = buffer[0];
          local_190.field_2._M_local_buf[1] = buffer[1];
          local_190.field_2._M_local_buf[2] = buffer[2];
          local_190.field_2._M_local_buf[3] = buffer[3];
          local_190.field_2._M_local_buf[4] = buffer[4];
          local_190.field_2._M_local_buf[5] = buffer[5];
          local_190.field_2._M_local_buf[6] = buffer[6];
          local_190.field_2._M_local_buf[7] = (char)buffer._7_4_;
          local_190._M_string_length = 0xb;
          local_190.field_2._M_local_buf[0xb] = '\0';
          std::__cxx11::string::operator=((string *)&entry,(string *)&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          FatFilename::getFilename_abi_cxx11_(&local_190,&filename);
          std::__cxx11::string::operator=((string *)&entry.longName,(string *)&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          entry.size = (unsigned_long_long)(uint)buffer._28_4_;
          entry.cluster = buffer._20_4_ << 0x10 | (uint)(ushort)buffer._26_2_;
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,buffer,&entries);
          FatEntry::setData(&entry,&local_168);
          std::__cxx11::string::~string((string *)&local_168);
          bVar3 = FatEntry::isZero(&entry);
          bVar1 = 1;
          if (!bVar3) {
            bVar3 = FatEntry::isCorrect(&entry);
            if ((bVar3) && ((ulong)entry.cluster < this->totalClusters)) {
              FatDate::FatDate((FatDate *)&local_190,buffer + 0x10);
              entry.creationDate.d._3_1_ = local_190.field_2._M_local_buf[7];
              entry.creationDate._16_7_ = local_190.field_2._M_allocated_capacity._0_7_;
              entry.creationDate._0_8_ = local_190._M_dataplus._M_p;
              entry.creationDate.s = (undefined4)local_190._M_string_length;
              entry.creationDate.y = local_190._M_string_length._4_4_;
              FatDate::FatDate((FatDate *)&local_190,buffer + 0x16);
              entry.changeDate.d._3_1_ = local_190.field_2._M_local_buf[7];
              entry.changeDate._16_7_ = local_190.field_2._M_allocated_capacity._0_7_;
              entry.changeDate._0_8_ = local_190._M_dataplus._M_p;
              entry.changeDate.s = (undefined4)local_190._M_string_length;
              entry.changeDate.y = local_190._M_string_length._4_4_;
              std::vector<FatEntry,_std::allocator<FatEntry>_>::push_back(&entries,&entry);
              local_1ec = local_1ec + 1;
              local_1f0 = local_1f0 + 1;
              if ((local_1f8 & 1) == 0) {
                FatEntry::getFilename_abi_cxx11_(&local_190,&entry);
                local_1f9 = std::operator==(&local_190,".");
                uVar2 = cluster_local;
                local_1dc = entry.cluster;
                std::__cxx11::string::~string((string *)&local_190);
                uVar4 = local_1f8 & 0xff;
                local_1f8 = uVar4;
                if (local_1dc == uVar2) {
                  local_1f8 = 1;
                }
                if (local_1f9 == '\0') {
                  local_1f8 = uVar4;
                }
              }
            }
            else {
              local_1e4 = local_1e4 + 1;
              local_1e8 = local_1e8 + 1;
            }
            bVar1 = 0;
          }
        }
        address = address + 0x20;
        FatEntry::~FatEntry(&entry);
      }
      if (local_1fa == '\0') {
        uVar4 = nextCluster(this,cluster_local,0);
        uVar5 = (ulong)uVar4;
LAB_0010efbc:
        cluster_local = (uint)uVar5;
      }
      else {
        uVar5 = (ulong)(cluster_local + 1);
        if (uVar5 < this->rootClusters) goto LAB_0010efbc;
        cluster_local = 0xffffffff;
        uVar5 = 0xffffffffffffffff;
      }
      if (clusters != (int *)0x0) {
        *clusters = *clusters + 1;
      }
      bVar3 = (int)uVar5 == 0;
      uVar4 = CONCAT31((int3)(local_1f4 >> 8),(byte)local_1f4 | bVar3);
      if ((local_1f4 & 1) != 0 || bVar3) {
        if (local_170 != (bool *)0x0) {
          *local_170 = true;
        }
        if (((bool)(bVar1 | local_1ec == 0)) || (local_1ec <= local_1e4)) {
          local_1f4 = uVar4;
          if (clusters != (int *)0x0 && local_1ec == 0) {
            *clusters = *clusters + -1;
          }
          break;
        }
        cluster_local = uVar2 + 1;
        uVar5 = (ulong)cluster_local;
      }
      if (((local_1f8 & 1) == 0) && (local_1f0 < local_1e8)) {
        local_1f4 = uVar4;
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "! Entries don\'t look good, this is maybe not a directory");
        std::endl<char,std::char_traits<char>>(poVar7);
        goto LAB_0010f09e;
      }
      local_1f4 = uVar4;
    } while ((int)uVar5 != -1);
    (__return_storage_ptr__->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
    super__Vector_impl_data._M_start =
         entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
LAB_0010f09e:
    (__return_storage_ptr__->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  FatFilename::~FatFilename(&filename);
  std::vector<FatEntry,_std::allocator<FatEntry>_>::~vector(&entries);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&visited._M_t);
  return __return_storage_ptr__;
}

Assistant:

vector<FatEntry> FatSystem::getEntries(unsigned int cluster, int *clusters, bool *hasFree)
{
    bool isRoot = false;
    bool contiguous = false;
    int foundEntries = 0;
    int badEntries = 0;
    bool isValid = false;
    set<unsigned int> visited;
    vector<FatEntry> entries;
    FatFilename filename;

    if (clusters != NULL) {
        *clusters = 0;
    }

    if (hasFree != NULL) {
        *hasFree = false;
    }

    if (cluster == 0 && type == FAT32) {
        cluster = rootDirectory;
    }

    isRoot = (type==FAT16 && cluster==rootDirectory);

    if (cluster == rootDirectory) {
        isValid = true;
    }

    if (!validCluster(cluster)) {
        return vector<FatEntry>();
    }

    do {
        bool localZero = false;
        int localFound = 0;
        int localBadEntries = 0;
        unsigned long long address = clusterAddress(cluster, isRoot);
        char buffer[FAT_ENTRY_SIZE];
        if (visited.find(cluster) != visited.end()) {
            cerr << "! Looping directory" << endl;
            break;
        }
        visited.insert(cluster);

        unsigned int i;
        for (i=0; i<bytesPerCluster; i+=sizeof(buffer)) {
            // Reading data
            readData(address, buffer, sizeof(buffer));

            // Creating entry
            FatEntry entry;

            entry.attributes = buffer[FAT_ATTRIBUTES];
            entry.address = address;

            if (entry.attributes == FAT_ATTRIBUTES_LONGFILE) {
                // Long file part
                filename.append(buffer);
            } else {
                entry.shortName = string(buffer, 11);
                entry.longName = filename.getFilename();
                entry.size = FAT_READ_LONG(buffer, FAT_FILESIZE)&0xffffffff;
                entry.cluster = (FAT_READ_SHORT(buffer, FAT_CLUSTER_LOW)&0xffff) | (FAT_READ_SHORT(buffer, FAT_CLUSTER_HIGH)<<16);
                entry.setData(string(buffer, sizeof(buffer)));

                if (!entry.isZero()) {
                    if (entry.isCorrect() && validCluster(entry.cluster)) {
                        entry.creationDate = FatDate(&buffer[FAT_CREATION_DATE]);
                        entry.changeDate = FatDate(&buffer[FAT_CHANGE_DATE]);
                        entries.push_back(entry);
                        localFound++;
                        foundEntries++;

                        if (!isValid && entry.getFilename() == "." && entry.cluster == cluster) {
                            isValid = true;
                        }
                    } else {
                        localBadEntries++;
                        badEntries++;
                    }

                    localZero = false;
                } else {
                    localZero = true;
                }
            }

            address += sizeof(buffer);
        }

        int previousCluster = cluster;

        if (isRoot) {
            if (cluster+1 < rootClusters) {
                cluster++;
            } else {
                cluster = FAT_LAST;
            }
        } else {
            cluster = nextCluster(cluster);
        }

        if (clusters) {
            (*clusters)++;
        }

        if (cluster == 0 || contiguous) {
            contiguous = true;

            if (hasFree != NULL) {
                *hasFree = true;
            }
            if (!localZero && localFound && localBadEntries<localFound) {
                cluster = previousCluster+1;
            } else {
                if (!localFound && clusters) {
                    (*clusters)--;
                }
                break;
            }
        }

        if (!isValid) {
            if (badEntries>foundEntries) {
                cerr << "! Entries don't look good, this is maybe not a directory" << endl;
                return vector<FatEntry>();
          }
        }
    } while (cluster != FAT_LAST);

    return entries;
}